

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O2

uint16_t vpatch(dw_rom *rom,uint32_t address,uint32_t size,...)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uint8_t *local_d0;
  uint8_t local_b8 [56];
  va_list arg;
  
  puVar2 = rom->content + address;
  local_d0 = &stack0x00000008;
  uVar4 = 0x18;
  iVar1 = -((int)rom->content + address);
  while (bVar6 = size != 0, size = size - 1, bVar6) {
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      puVar3 = local_b8 + uVar5;
    }
    else {
      puVar3 = local_d0;
      local_d0 = local_d0 + 8;
    }
    *puVar2 = *puVar3;
    puVar2 = puVar2 + 1;
    iVar1 = iVar1 + -1;
  }
  return -((short)iVar1 + *(short *)&rom->content);
}

Assistant:

uint16_t vpatch(const dw_rom *rom, const uint32_t address, const uint32_t size,
        ...)
{
    uint32_t i;
    va_list arg;
    uint8_t *p;

    p = &rom->content[address];
    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p - rom->content;
}